

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<chrono::ChFseqNode>
          (ChArchiveOut *this,
          ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>
          *bVal)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *plVar1;
  _List_node_base *p_Var2;
  long lVar3;
  ChValueSpecific<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>
  specVal;
  char buffer [20];
  ChNameValue<chrono::ChFseqNode> local_98;
  ChValueSpecific<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>
  local_80;
  char local_48 [24];
  
  ChValueSpecific<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>::
  ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_80,
             (bVal->_value->
             super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>)._M_impl.
             _M_node._M_size);
  lVar3 = 0;
  plVar1 = bVal->_value;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)p_Var2)->
                  super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>)._M_impl
                  ._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)plVar1) {
    sprintf(local_48,"%lu",lVar3);
    local_98._value = (ChFseqNode *)(p_Var2 + 1);
    local_98._flags = '\0';
    local_98._name = local_48;
    out<chrono::ChFseqNode>(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&local_80,
               (bVal->_value->
               super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>)._M_impl.
               _M_node._M_size);
    lVar3 = lVar3 + 1;
    plVar1 = bVal->_value;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])
            (this,&local_80,
             (plVar1->super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>).
             _M_impl._M_node._M_size);
  ChValue::~ChValue(&local_80.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::list<T> > bVal) {
          ChValueSpecific< std::list<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          typename std::list<T>::iterator iter;
          size_t i = 0;
          for (iter = bVal.value().begin(); iter != bVal.value().end(); ++iter, ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, (*iter));
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }